

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-flat-test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_161d77::
InterfaceTester_QuadraticConstraint_QuadConstraintIsPassedToBackend__OldSyntax_Test::
~InterfaceTester_QuadraticConstraint_QuadConstraintIsPassedToBackend__OldSyntax_Test
          (InterfaceTester_QuadraticConstraint_QuadConstraintIsPassedToBackend__OldSyntax_Test *this
          )

{
  (this->super_InterfaceTester_QuadraticConstraint).super_Test._vptr_Test =
       (_func_int **)&PTR__InterfaceTesterWithBackendAcceptingConstraints_005c1c80;
  mp::BasicSolver::~BasicSolver(&(this->super_InterfaceTester_QuadraticConstraint).env_);
  mp::
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~ProblemFlattener(&(this->super_InterfaceTester_QuadraticConstraint).interface_.
                       super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     );
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x82d8);
  return;
}

Assistant:

TEST_F(InterfaceTester_QuadraticConstraint, QuadConstraintIsPassedToBackend__OldSyntax) {
  auto con=GetModel().AddCon(5.0, 5.0);
  const auto args = GetInterface().AddVars(2, -1.0, 11.0);
  con.set_nonlinear_expr(GetModel().MakeBinary(mp::expr::MUL,
                                               GetModel().MakeVariable( args[0] ),
                                               GetModel().MakeVariable( args[1] ) ) );
  GetInterface().ConvertModel();
  auto qt = mp::QuadTerms{ {1.0}, {args[0]}, {args[1]} };
  ASSERT_HAS_CONSTRAINT( GetBackend(), mp::QuadConRange(
                           { mp::LinTerms{}, std::move(qt) },
    {5.0, 5.0} ) );
}